

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_diag_m(REF_DBL *m,REF_DBL *d)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_1b8;
  double local_1b0;
  double local_1a0;
  double local_198;
  double local_190;
  double local_178;
  double local_170;
  double local_168;
  double local_150;
  double local_148;
  double local_138;
  double local_128;
  double local_120;
  double local_110;
  double local_108;
  double local_f8;
  double dStack_e8;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL s2;
  int local_d8;
  REF_INT k;
  REF_INT ii;
  REF_INT mml;
  REF_DBL el1;
  REF_DBL c3;
  REF_DBL c2;
  REF_DBL c;
  REF_DBL dl1;
  REF_DBL r;
  REF_DBL p;
  REF_DBL g;
  REF_DBL h;
  REF_INT l2;
  REF_INT l1;
  REF_INT mm;
  REF_INT l;
  REF_INT j;
  REF_INT i;
  REF_DBL tst2;
  REF_DBL tst1;
  REF_DBL f;
  REF_DBL e [3];
  REF_DBL s;
  REF_DBL v;
  REF_DBL u;
  REF_DBL L;
  REF_DBL *d_local;
  REF_DBL *m_local;
  
  if ((((0x7fefffffffffffff < (ulong)ABS(*m)) || (0x7fefffffffffffff < (ulong)ABS(m[1]))) ||
      (0x7fefffffffffffff < (ulong)ABS(m[2]))) ||
     (((0x7fefffffffffffff < (ulong)ABS(m[3]) || (0x7fefffffffffffff < (ulong)ABS(m[4]))) ||
      (0x7fefffffffffffff < (ulong)ABS(m[5]))))) {
    return 3;
  }
  dVar3 = sqrt(m[1] * m[1] + m[2] * m[2]);
  if (dVar3 * 1e+20 <= 0.0) {
    local_f8 = -(dVar3 * 1e+20);
  }
  else {
    local_f8 = dVar3 * 1e+20;
  }
  if (m[1] <= 0.0) {
    local_108 = -m[1];
  }
  else {
    local_108 = m[1];
  }
  if (local_108 < local_f8) {
    if (dVar3 * 1e+20 <= 0.0) {
      local_110 = -(dVar3 * 1e+20);
    }
    else {
      local_110 = dVar3 * 1e+20;
    }
    if (m[2] <= 0.0) {
      local_120 = -m[2];
    }
    else {
      local_120 = m[2];
    }
    if (local_120 < local_110) {
      dVar4 = m[1] / dVar3;
      dVar3 = m[2] / dVar3;
      e[2] = dVar4 * 2.0 * m[4] + dVar3 * (m[5] - m[3]);
      *d = *m;
      d[1] = dVar3 * e[2] + m[3];
      d[2] = -dVar3 * e[2] + m[5];
      d[3] = 1.0;
      d[4] = 0.0;
      d[5] = 0.0;
      d[6] = 0.0;
      d[7] = dVar4;
      d[8] = dVar3;
      d[9] = 0.0;
      d[10] = dVar3;
      d[0xb] = -dVar4;
      e[0] = -dVar4 * e[2] + m[4];
      goto LAB_0019a6e5;
    }
  }
  *d = *m;
  d[1] = m[3];
  d[2] = m[5];
  d[3] = 1.0;
  d[4] = 0.0;
  d[5] = 0.0;
  d[6] = 0.0;
  d[7] = 1.0;
  d[8] = 0.0;
  d[9] = 0.0;
  d[10] = 0.0;
  d[0xb] = 1.0;
  e[0] = m[4];
LAB_0019a6e5:
  el1 = 0.0;
  dStack_e8 = 0.0;
  tst1 = 0.0;
  tst2 = 0.0;
  e[1] = 0.0;
  l1 = 0;
  do {
    if (2 < l1) {
      return 0;
    }
    mm = 0;
    if (d[l1] <= 0.0) {
      local_128 = -d[l1];
    }
    else {
      local_128 = d[l1];
    }
    if (e[(long)l1 + -1] <= 0.0) {
      local_138 = -e[(long)l1 + -1];
    }
    else {
      local_138 = e[(long)l1 + -1];
    }
    if (tst2 < local_128 + local_138) {
      tst2 = local_128 + local_138;
    }
    for (l2 = l1; l2 < 3; l2 = l2 + 1) {
      if (e[(long)l2 + -1] <= 0.0) {
        local_148 = -e[(long)l2 + -1];
      }
      else {
        local_148 = e[(long)l2 + -1];
      }
      local_150 = tst2 + local_148;
      if (local_150 - tst2 <= 0.0) {
        local_150 = -(local_150 - tst2);
      }
      else {
        local_150 = local_150 - tst2;
      }
      if (local_150 < 1e-14) break;
    }
    if (l2 != l1) {
      do {
        mm = mm + 1;
        if (0x1e < mm) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
                 200,"ref_matrix_diag_m",1,"not converged");
          return 1;
        }
        iVar1 = l1 + 1;
        l = l1 + 2;
        dVar3 = d[l1];
        dVar4 = (d[iVar1] - dVar3) / (e[(long)l1 + -1] * 2.0);
        local_1a0 = sqrt(dVar4 * dVar4 + 1.0);
        if (dVar4 < 0.0) {
          local_178 = local_1a0;
          if (local_1a0 <= 0.0) {
            local_178 = -local_1a0;
          }
          local_170 = -local_178;
        }
        else {
          local_168 = local_1a0;
          if (local_1a0 <= 0.0) {
            local_168 = -local_1a0;
          }
          local_170 = local_168;
        }
        d[l1] = e[(long)l1 + -1] / (dVar4 + local_170);
        if (dVar4 < 0.0) {
          if (local_1a0 <= 0.0) {
            local_1a0 = -local_1a0;
          }
          local_198 = -local_1a0;
        }
        else {
          local_190 = local_1a0;
          if (local_1a0 <= 0.0) {
            local_190 = -local_1a0;
          }
          local_198 = local_190;
        }
        d[iVar1] = e[(long)l1 + -1] * (dVar4 + local_198);
        dVar4 = d[iVar1];
        dVar3 = dVar3 - d[l1];
        if (l < 3) {
          for (; l < 3; l = l + 1) {
            d[l] = d[l] - dVar3;
          }
        }
        tst1 = tst1 + dVar3;
        r = d[l2];
        c2 = 1.0;
        c3 = 1.0;
        dVar3 = e[(long)iVar1 + -1];
        e[2] = 0.0;
        for (local_d8 = 0; local_d8 < l2 - l1; local_d8 = local_d8 + 1) {
          el1 = c3;
          c3 = c2;
          dStack_e8 = e[2];
          iVar1 = l2 - local_d8;
          iVar2 = iVar1 + -1;
          dVar5 = c2 * e[(long)iVar2 + -1];
          dVar6 = c2 * r;
          dVar7 = sqrt(r * r + e[(long)iVar2 + -1] * e[(long)iVar2 + -1]);
          e[(long)iVar1 + -1] = e[2] * dVar7;
          e[2] = e[(long)iVar2 + -1] / dVar7;
          c2 = r / dVar7;
          r = c2 * d[iVar2] + -(e[2] * dVar5);
          d[iVar1] = e[2] * (c2 * dVar5 + e[2] * d[iVar2]) + dVar6;
          for (s2._4_4_ = 0; s2._4_4_ < 3; s2._4_4_ = s2._4_4_ + 1) {
            dVar5 = d[s2._4_4_ + 3 + iVar1 * 3];
            d[s2._4_4_ + 3 + iVar1 * 3] = e[2] * d[s2._4_4_ + 3 + iVar2 * 3] + c2 * dVar5;
            d[s2._4_4_ + 3 + iVar2 * 3] = c2 * d[s2._4_4_ + 3 + iVar2 * 3] + -(e[2] * dVar5);
          }
        }
        dVar4 = (-e[2] * dStack_e8 * el1 * dVar3 * e[(long)l1 + -1]) / dVar4;
        e[(long)l1 + -1] = e[2] * dVar4;
        d[l1] = c2 * dVar4;
        if (e[(long)l1 + -1] <= 0.0) {
          local_1b0 = -e[(long)l1 + -1];
        }
        else {
          local_1b0 = e[(long)l1 + -1];
        }
        local_1b8 = tst2 + local_1b0;
        if (local_1b8 - tst2 <= 0.0) {
          local_1b8 = -(local_1b8 - tst2);
        }
        else {
          local_1b8 = local_1b8 - tst2;
        }
      } while (1e-14 <= local_1b8);
    }
    d[l1] = d[l1] + tst1;
    l1 = l1 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_matrix_diag_m(REF_DBL *m, REF_DBL *d) {
  REF_DBL L, u, v, s;
  REF_DBL e[3];

  REF_DBL f, tst1, tst2;
  REF_INT i, j, l, mm;
  REF_INT l1, l2;
  REF_DBL h, g, p, r, dl1;
  REF_DBL c, c2, c3, el1;
  REF_INT mml, ii, k;
  REF_DBL s2;

  /* potential for stack corruption, if inf or nan */
  if (!isfinite(m[0]) || !isfinite(m[1]) || !isfinite(m[2]) ||
      !isfinite(m[3]) || !isfinite(m[4]) || !isfinite(m[5])) {
    return REF_INVALID;
  }

  /* one rotation to make tridiagonal ( zero out m[2] ) */
  /* http://www.geometrictools.com/Documentation/EigenSymmetricNxN.pdf */
  /* Eigen System Solvers for Symmetric Matrices, David Eberly */

  L = sqrt(m[1] * m[1] + m[2] * m[2]);

  if (ref_math_divisible(m[1], L) && ref_math_divisible(m[2], L)) {
    u = m[1] / L;
    v = m[2] / L;
    s = 2.0 * u * m[4] + v * (m[5] - m[3]);

    ref_matrix_eig(d, 0) = m[0];
    ref_matrix_eig(d, 1) = m[3] + v * s;
    ref_matrix_eig(d, 2) = m[5] - v * s;

    ref_matrix_vec(d, 0, 0) = 1.0;
    ref_matrix_vec(d, 1, 0) = 0.0;
    ref_matrix_vec(d, 2, 0) = 0.0;

    ref_matrix_vec(d, 0, 1) = 0.0;
    ref_matrix_vec(d, 1, 1) = u;
    ref_matrix_vec(d, 2, 1) = v;

    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = v;
    ref_matrix_vec(d, 2, 2) = -u;

    e[0] = L;
    e[1] = m[4] - u * s;
    e[2] = 0.0;
  } else {
    ref_matrix_eig(d, 0) = m[0];
    ref_matrix_eig(d, 1) = m[3];
    ref_matrix_eig(d, 2) = m[5];

    ref_matrix_vec(d, 0, 0) = 1.0;
    ref_matrix_vec(d, 1, 0) = 0.0;
    ref_matrix_vec(d, 2, 0) = 0.0;

    ref_matrix_vec(d, 0, 1) = 0.0;
    ref_matrix_vec(d, 1, 1) = 1.0;
    ref_matrix_vec(d, 2, 1) = 0.0;

    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = 0.0;
    ref_matrix_vec(d, 2, 2) = 1.0;

    e[0] = m[1];
    e[1] = m[4];
    e[2] = 0.0;
  }

  c3 = 0;
  s2 = 0; /* quiet -Wall used without set compiler warning */

  f = 0.0;
  tst1 = 0.0;
  e[2] = 0.0;

#define gridSign(a, b) (b >= 0 ? ABS(a) : -ABS(a))

  for (l = 0; l < 3; l++) { /* row_loop  */
    j = 0;
    h = ABS(d[l]) + ABS(e[l]);
    if (tst1 < h) tst1 = h;
    /* look for small sub-diagonal element */
    for (mm = l; mm < 3; mm++) { /*test_for_zero_e */
      tst2 = tst1 + ABS(e[mm]);
      if (ABS(tst2 - tst1) < 1.0e-14) break;
      /* e[2] is always zero, so there is no exit through the bottom of loop*/
    }
    if (mm != l) { /* l_not_equal_mm */
      do {
        j = j + 1;
        /* set error -- no convergence to an eigenvalue after 30 iterations */
        if (j > 30) {
          RSS(REF_FAILURE, "not converged");
        }
        /* form shift */
        l1 = l + 1;
        l2 = l1 + 1;
        g = d[l];
        p = (d[l1] - g) / (2.0 * e[l]);
        r = sqrt(p * p + 1.0);
        d[l] = e[l] / (p + gridSign(r, p));
        d[l1] = e[l] * (p + gridSign(r, p));
        dl1 = d[l1];
        h = g - d[l];
        if (l2 <= 2) {
          for (i = l2; i < 3; i++) {
            d[i] = d[i] - h;
          }
        }
        f = f + h;
        /* ql transformation */
        p = d[mm];
        c = 1.0;
        c2 = c;
        el1 = e[l1];
        s = 0.0;
        mml = mm - l;
        for (ii = 0; ii < mml; ii++) {
          c3 = c2;
          c2 = c;
          s2 = s;
          i = mm - ii - 1;
          g = c * e[i];
          h = c * p;
          r = sqrt(p * p + e[i] * e[i]);
          e[i + 1] = s * r;
          s = e[i] / r;
          c = p / r;
          p = c * d[i] - s * g;
          d[i + 1] = h + s * (c * g + s * d[i]);
          /* form vector */
          for (k = 0; k < 3; k++) {
            h = ref_matrix_vec(d, k, i + 1);
            ref_matrix_vec(d, k, i + 1) = s * ref_matrix_vec(d, k, i) + c * h;
            ref_matrix_vec(d, k, i) = c * ref_matrix_vec(d, k, i) - s * h;
          }
        }
        p = -s * s2 * c3 * el1 * e[l] / dl1;
        e[l] = s * p;
        d[l] = c * p;
        tst2 = tst1 + ABS(e[l]);
        if (ABS(tst2 - tst1) < 1.0e-14) break;
      } while (REF_TRUE); /* iterate */
    }                     /* l_not_equal_mm */
    d[l] = d[l] + f;
  } /* row_loop */

  return REF_SUCCESS;
}